

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

aiScene * __thiscall Assimp::Importer::ApplyPostProcessing(Importer *this,uint pFlags)

{
  uint *puVar1;
  BaseProcess *this_00;
  __uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  _Var2;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  int *piVar6;
  ImporterPimpl *pIVar7;
  aiScene *paVar8;
  _Rb_tree_header *p_Var9;
  pointer ppBVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ValidateDSProcess ds;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  string local_58;
  __uniq_ptr_impl<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  local_38;
  
  paVar8 = this->pimpl->mScene;
  if (paVar8 == (aiScene *)0x0) {
LAB_0033be3c:
    paVar8 = (aiScene *)0x0;
  }
  else {
    if (pFlags == 0) {
      return paVar8;
    }
    bVar3 = _ValidateFlags(pFlags);
    if (!bVar3) {
      __assert_fail("_ValidateFlags(pFlags)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Importer.cpp"
                    ,0x2de,"const aiScene *Assimp::Importer::ApplyPostProcessing(unsigned int)");
    }
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"Entering post processing pipeline");
    if ((pFlags >> 10 & 1) != 0) {
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)&local_58);
      BaseProcess::ExecuteOnScene((BaseProcess *)&local_58,this);
      paVar8 = this->pimpl->mScene;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_58);
      if (paVar8 == (aiScene *)0x0) goto LAB_0033be3c;
    }
    uVar13 = (ulong)(pFlags | 0x400);
    if (this->pimpl->bExtraVerbose == false) {
      uVar13 = (ulong)pFlags;
    }
    local_58._M_dataplus._M_p = (pointer)((ulong)local_58._M_dataplus._M_p._4_4_ << 0x20);
    piVar6 = GetGenericProperty<int>
                       (&this->pimpl->mIntProperties,"GLOB_MEASURE_TIME",(int *)&local_58);
    if (*piVar6 == 0) {
      local_38._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (tuple<Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>)
           (_Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
            )0x0;
    }
    else {
      local_38._M_t.
      super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
      .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
           (tuple<Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>)
           operator_new(0x30);
      p_Var9 = &(((Profiler *)
                 local_38._M_t.
                 super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                 .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions
                )._M_t._M_impl.super__Rb_tree_header;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_left = &p_Var9->_M_header;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_right = &p_Var9->_M_header;
      (((Profiler *)
       local_38._M_t.
       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl)->regions)._M_t.
      _M_impl.super__Rb_tree_header._M_node_count = 0;
    }
    pIVar7 = this->pimpl;
    ppBVar10 = (pIVar7->mPostProcessingSteps).
               super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)(pIVar7->mPostProcessingSteps).
                   super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar10;
    if (lVar11 != 0) {
      uVar12 = lVar11 >> 3;
      uVar14 = 0;
      do {
        this_00 = ppBVar10[uVar14];
        (*pIVar7->mProgressHandler->_vptr_ProgressHandler[4])
                  (pIVar7->mProgressHandler,uVar14,uVar12);
        iVar4 = (*this_00->_vptr_BaseProcess[2])(this_00,uVar13);
        _Var2._M_t.
        super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
        .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
             local_38._M_t.
             super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
             .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
        if ((char)iVar4 != '\0') {
          if (local_38._M_t.
              super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
              .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               )0x0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"postprocess","");
            Profiling::Profiler::BeginRegion
                      ((Profiler *)
                       _Var2._M_t.
                       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                       &local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
          BaseProcess::ExecuteOnScene(this_00,this);
          _Var2._M_t.
          super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
          .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl =
               local_38._M_t.
               super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl;
          if ((_Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
               )local_38._M_t.
                super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl !=
              (Profiler *)0x0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"postprocess","");
            Profiling::Profiler::EndRegion
                      ((Profiler *)
                       _Var2._M_t.
                       super__Tuple_impl<0UL,_Assimp::Profiling::Profiler_*,_std::default_delete<Assimp::Profiling::Profiler>_>
                       .super__Head_base<0UL,_Assimp::Profiling::Profiler_*,_false>._M_head_impl,
                       &local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
          }
        }
        pIVar7 = this->pimpl;
        if (pIVar7->mScene == (aiScene *)0x0) break;
        if (pIVar7->bExtraVerbose == true) {
          pLVar5 = DefaultLogger::get();
          Logger::debug(pLVar5,"Verbose Import: re-validating data structures");
          ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)&local_58);
          BaseProcess::ExecuteOnScene((BaseProcess *)&local_58,this);
          if (this->pimpl->mScene == (aiScene *)0x0) {
            pLVar5 = DefaultLogger::get();
            Logger::error(pLVar5,"Verbose Import: failed to re-validate data structures");
            ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_58);
            pIVar7 = this->pimpl;
            break;
          }
          ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_58);
          pIVar7 = this->pimpl;
        }
        uVar14 = (ulong)((int)uVar14 + 1);
        ppBVar10 = (pIVar7->mPostProcessingSteps).
                   super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = (long)(pIVar7->mPostProcessingSteps).
                       super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar10 >> 3;
      } while (uVar14 < uVar12);
    }
    (*pIVar7->mProgressHandler->_vptr_ProgressHandler[4])
              (pIVar7->mProgressHandler,
               (ulong)((long)(pIVar7->mPostProcessingSteps).
                             super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pIVar7->mPostProcessingSteps).
                            super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff);
    pIVar7 = this->pimpl;
    if (pIVar7->mScene != (aiScene *)0x0) {
      puVar1 = (uint *)((long)pIVar7->mScene->mPrivate + 8);
      *puVar1 = *puVar1 | (uint)uVar13;
      pIVar7 = this->pimpl;
    }
    SharedPostProcessInfo::Clean(pIVar7->mPPShared);
    pLVar5 = DefaultLogger::get();
    Logger::info(pLVar5,"Leaving post processing pipeline");
    std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ::~unique_ptr((unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                   *)&local_38);
    paVar8 = this->pimpl->mScene;
  }
  return paVar8;
}

Assistant:

const aiScene* Importer::ApplyPostProcessing(unsigned int pFlags)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // Return immediately if no scene is active
    if (!pimpl->mScene) {
        return NULL;
    }

    // If no flags are given, return the current scene with no further action
    if (!pFlags) {
        return pimpl->mScene;
    }

    // In debug builds: run basic flag validation
    ai_assert(_ValidateFlags(pFlags));
    ASSIMP_LOG_INFO("Entering post processing pipeline");

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    // The ValidateDS process plays an exceptional role. It isn't contained in the global
    // list of post-processing steps, so we need to call it manually.
    if (pFlags & aiProcess_ValidateDataStructure)
    {
        ValidateDSProcess ds;
        ds.ExecuteOnScene (this);
        if (!pimpl->mScene) {
            return NULL;
        }
    }
#endif // no validation
#ifdef ASSIMP_BUILD_DEBUG
    if (pimpl->bExtraVerbose)
    {
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        ASSIMP_LOG_ERROR("Verbose Import is not available due to build settings");
#endif  // no validation
        pFlags |= aiProcess_ValidateDataStructure;
    }
#else
    if (pimpl->bExtraVerbose) {
        ASSIMP_LOG_WARN("Not a debug build, ignoring extra verbose setting");
    }
#endif // ! DEBUG

    std::unique_ptr<Profiler> profiler(GetPropertyInteger(AI_CONFIG_GLOB_MEASURE_TIME,0)?new Profiler():NULL);
    for( unsigned int a = 0; a < pimpl->mPostProcessingSteps.size(); a++)   {

        BaseProcess* process = pimpl->mPostProcessingSteps[a];
        pimpl->mProgressHandler->UpdatePostProcess(static_cast<int>(a), static_cast<int>(pimpl->mPostProcessingSteps.size()) );
        if( process->IsActive( pFlags)) {

            if (profiler) {
                profiler->BeginRegion("postprocess");
            }

            process->ExecuteOnScene ( this );

            if (profiler) {
                profiler->EndRegion("postprocess");
            }
        }
        if( !pimpl->mScene) {
            break;
        }
#ifdef ASSIMP_BUILD_DEBUG

#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        continue;
#endif  // no validation

        // If the extra verbose mode is active, execute the ValidateDataStructureStep again - after each step
        if (pimpl->bExtraVerbose)   {
            ASSIMP_LOG_DEBUG("Verbose Import: re-validating data structures");

            ValidateDSProcess ds;
            ds.ExecuteOnScene (this);
            if( !pimpl->mScene) {
                ASSIMP_LOG_ERROR("Verbose Import: failed to re-validate data structures");
                break;
            }
        }
#endif // ! DEBUG
    }
    pimpl->mProgressHandler->UpdatePostProcess( static_cast<int>(pimpl->mPostProcessingSteps.size()), 
        static_cast<int>(pimpl->mPostProcessingSteps.size()) );

    // update private scene flags
    if( pimpl->mScene )
      ScenePriv(pimpl->mScene)->mPPStepsApplied |= pFlags;

    // clear any data allocated by post-process steps
    pimpl->mPPShared->Clean();
    ASSIMP_LOG_INFO("Leaving post processing pipeline");

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}